

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.cc
# Opt level: O1

void __thiscall
google::protobuf::Arena::AddListNode(Arena *this,void *elem,_func_void_void_ptr *cleanup)

{
  undefined8 uVar1;
  undefined8 *puVar2;
  
  puVar2 = (undefined8 *)AllocateAligned(this,(type_info *)0x0,0x18);
  *puVar2 = elem;
  puVar2[1] = cleanup;
  LOCK();
  uVar1 = *(undefined8 *)(this + 0x20);
  *(undefined8 **)(this + 0x20) = puVar2;
  UNLOCK();
  puVar2[2] = uVar1;
  return;
}

Assistant:

void Arena::AddListNode(void* elem, void (*cleanup)(void*)) {
  Node* node = reinterpret_cast<Node*>(AllocateAligned(sizeof(Node)));
  node->elem = elem;
  node->cleanup = cleanup;
  node->next = reinterpret_cast<Node*>(
      google::protobuf::internal::NoBarrier_AtomicExchange(&cleanup_list_,
            reinterpret_cast<google::protobuf::internal::AtomicWord>(node)));
}